

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O3

int x509_get_crl_ext(uchar **p,uchar *end,mbedtls_x509_buf *ext)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  size_t len;
  size_t local_28;
  
  local_28 = 0;
  iVar1 = mbedtls_x509_get_ext(p,end,ext,0);
  iVar2 = 0;
  if ((iVar1 != -0x62) && (iVar2 = iVar1, iVar1 == 0)) {
    puVar3 = *p;
    while (puVar3 < end) {
      iVar2 = mbedtls_asn1_get_tag(p,end,&local_28,0x30);
      if (iVar2 != 0) {
        return iVar2 + -0x2500;
      }
      puVar3 = *p + local_28;
      *p = puVar3;
    }
    iVar2 = -0x2566;
    if (puVar3 == end) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int x509_get_crl_ext( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_buf *ext )
{
    int ret;
    size_t len = 0;

    /* Get explicit tag */
    if( ( ret = mbedtls_x509_get_ext( p, end, ext, 0) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    while( *p < end )
    {
        if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
                MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        *p += len;
    }

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}